

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringmatcher.cpp
# Opt level: O3

QStringMatcher * __thiscall QStringMatcher::operator=(QStringMatcher *this,QStringMatcher *other)

{
  storage_type_conflict *psVar1;
  
  if (this != other) {
    QArrayDataPointer<char16_t>::operator=(&(this->q_pattern).d,&(other->q_pattern).d);
    this->q_cs = other->q_cs;
    psVar1 = (other->q_sv).m_data;
    (this->q_sv).m_size = (other->q_sv).m_size;
    (this->q_sv).m_data = psVar1;
    memcpy(this->q_skiptable,other->q_skiptable,0x100);
  }
  return this;
}

Assistant:

QStringMatcher &QStringMatcher::operator=(const QStringMatcher &other)
{
    if (this != &other) {
        q_pattern = other.q_pattern;
        q_cs = other.q_cs;
        q_sv = other.q_sv;
        memcpy(q_skiptable, other.q_skiptable, sizeof(q_skiptable));
    }
    return *this;
}